

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O1

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *
dg::vr::RelationsAnalyzer::getFroms
          (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__return_storage_ptr__
          ,ValueRelations *rels,V val)

{
  pointer *pppVVar1;
  Value **__args;
  pointer ppVVar2;
  bool bVar3;
  bool bVar4;
  Handle h;
  Value *pVVar5;
  VectorSet<const_llvm::Value_*> *pVVar6;
  HandlePtr mVal;
  iterator iVar7;
  bool bVar8;
  GetElementPtrInst *gep;
  LoadInst *load;
  _Base_bitset<1UL> local_78;
  LoadInst *local_70;
  V local_68;
  _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
  local_60;
  
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = val;
  local_70 = ValueRelations::getInstance<llvm::LoadInst>(rels,val);
  h = ValueRelations::getHandle(rels,local_68);
  bVar4 = false;
  do {
    while (local_70 != (LoadInst *)0x0) {
      local_68 = *(V *)(local_70 + -0x20);
      h = ValueRelations::getHandle(rels,local_68);
      local_70 = ValueRelations::getInstance<llvm::LoadInst>(rels,local_68);
      iVar7._M_current =
           (__return_storage_ptr__->
           super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
        _M_realloc_insert<llvm::Value_const*&>
                  ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                   __return_storage_ptr__,iVar7,&local_68);
      }
      else {
        *iVar7._M_current = local_68;
        pppVVar1 = &(__return_storage_ptr__->
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppVVar1 = *pppVVar1 + 1;
      }
    }
    if (h == (Handle)0x0) {
      return __return_storage_ptr__;
    }
    if ((h->relatedBuckets)._M_elems[0xb].vec.
        super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (h->relatedBuckets)._M_elems[0xb].vec.
        super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      return __return_storage_ptr__;
    }
    local_78._M_w = 0x800;
    ValueRelations::getRelated<llvm::Value_const*>
              ((RelationsMap *)&local_60,rels,&local_68,(Relations *)&local_78);
    if (local_60._M_impl.super__Rb_tree_header._M_node_count == 1) {
      h = *(Handle *)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1);
      pVVar5 = (Value *)ValueRelations::getInstance<llvm::LoadInst>(rels,h);
      local_70 = (LoadInst *)pVVar5;
      if (pVVar5 == (Value *)0x0) {
        pVVar5 = (Value *)ValueRelations::getInstance<llvm::GetElementPtrInst>(rels,h);
        local_78._M_w = (_WordT)pVVar5;
        if (pVVar5 == (Value *)0x0) {
          pVVar6 = ValueRelations::getEqual(rels,h);
          __args = (pVVar6->vec).
                   super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          bVar8 = __args == (pVVar6->vec).
                            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
          bVar3 = !bVar8;
          if (bVar8) {
            bVar4 = true;
          }
          else {
            iVar7._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar7._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
              _M_realloc_insert<llvm::Value_const*const&>
                        ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                         __return_storage_ptr__,iVar7,__args);
            }
            else {
              *iVar7._M_current = *__args;
              pppVVar1 = &(__return_storage_ptr__->
                          super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
              *pppVVar1 = *pppVVar1 + 1;
            }
          }
          goto LAB_0011eddc;
        }
        iVar7._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current !=
            (__return_storage_ptr__->
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0011ed83;
        std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
        _M_realloc_insert<llvm::GetElementPtrInst_const*&>
                  ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                   __return_storage_ptr__,iVar7,(GetElementPtrInst **)&local_78);
      }
      else {
        iVar7._M_current =
             (__return_storage_ptr__->
             super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<llvm::Value_const*,std::allocator<llvm::Value_const*>>::
          _M_realloc_insert<llvm::LoadInst_const*&>
                    ((vector<llvm::Value_const*,std::allocator<llvm::Value_const*>> *)
                     __return_storage_ptr__,iVar7,&local_70);
        }
        else {
LAB_0011ed83:
          *iVar7._M_current = pVVar5;
          pppVVar1 = &(__return_storage_ptr__->
                      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppVVar1 = *pppVVar1 + 1;
        }
      }
      bVar3 = true;
    }
    else {
      bVar4 = true;
      bVar3 = false;
    }
LAB_0011eddc:
    std::
    _Rb_tree<std::reference_wrapper<const_dg::vr::Bucket>,_std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>,_std::less<std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<const_std::reference_wrapper<const_dg::vr::Bucket>,_dg::vr::Relations>_>_>
    ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
    if (!bVar3) {
      if ((!bVar4) &&
         (ppVVar2 = (__return_storage_ptr__->
                    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>).
                    _M_impl.super__Vector_impl_data._M_start, ppVVar2 != (pointer)0x0)) {
        operator_delete(ppVVar2,(long)(__return_storage_ptr__->
                                      super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>
                                      )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppVVar2);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::vector<V> RelationsAnalyzer::getFroms(const ValueRelations &rels, V val) {
    std::vector<V> result;
    const auto *load = rels.getInstance<llvm::LoadInst>(val);
    const auto *mH = rels.getHandle(val);

    while (load || (mH && rels.has(*mH, Relations::PF))) {
        if (load) {
            val = load->getPointerOperand();
            mH = rels.getHandle(val);
            load = rels.getInstance<llvm::LoadInst>(val);
            result.emplace_back(val);
        } else {
            const auto &pointedFrom = rels.getRelated(val, Relations().pf());
            if (pointedFrom.size() != 1)
                return result;
            mH = &pointedFrom.begin()->first.get();
            load = rels.getInstance<llvm::LoadInst>(*mH);
            if (load)
                result.emplace_back(load);
            else if (const auto *gep =
                             rels.getInstance<llvm::GetElementPtrInst>(*mH))
                result.emplace_back(gep);
            else {
                const auto &eqvals = rels.getEqual(*mH);
                if (eqvals.empty())
                    return result;
                result.emplace_back(*eqvals.begin());
            }
        }
    }

    return result;
}